

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void FromWabtValues(Store *store,wasm_val_vec_t *values,ValueTypes *types,Values *wabt_values)

{
  Type TVar1;
  ulong uVar2;
  wasm_val_vec_t *store_00;
  size_type sVar3;
  size_type sVar4;
  pointer pTVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  wasm_val_t wVar8;
  TypedValue local_58;
  wasm_valkind_t local_40;
  undefined7 uStack_3f;
  anon_union_8_5_30786955_for_of local_38;
  ulong local_30;
  size_t i;
  Values *wabt_values_local;
  ValueTypes *types_local;
  wasm_val_vec_t *values_local;
  Store *store_local;
  
  i = (size_t)wabt_values;
  wabt_values_local = (Values *)types;
  types_local = (ValueTypes *)values;
  values_local = (wasm_val_vec_t *)store;
  sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
  sVar4 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                    ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)i);
  if (sVar3 != sVar4) {
    __assert_fail("types.size() == wabt_values.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x1f2,
                  "void FromWabtValues(Store &, wasm_val_vec_t *, const ValueTypes &, const Values &)"
                 );
  }
  pTVar5 = (pointer)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)wabt_values_local)
  ;
  if (pTVar5 == (types_local->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start) {
    local_30 = 0;
    while( true ) {
      uVar2 = local_30;
      sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)wabt_values_local);
      store_00 = values_local;
      if (sVar3 <= uVar2) break;
      pvVar6 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)wabt_values_local,
                          local_30);
      local_58.type = *pvVar6;
      pvVar7 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::operator[]
                         ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)i,
                          local_30);
      local_58.value.field_0.i64_ = (pvVar7->field_0).i64_;
      local_58.value.field_0._8_8_ = *(undefined8 *)((long)&pvVar7->field_0 + 8);
      wVar8 = FromWabtValue((Store *)store_00,&local_58);
      local_38 = wVar8.of;
      local_40 = wVar8.kind;
      pTVar5 = (types_local->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish + local_30 * 2;
      TVar1._1_7_ = uStack_3f;
      TVar1.enum_._0_1_ = local_40;
      *pTVar5 = TVar1;
      ((anon_union_8_5_30786955_for_of *)(pTVar5 + 1))->i64 = (int64_t)local_38;
      local_30 = local_30 + 1;
    }
    return;
  }
  __assert_fail("types.size() == values->size",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,499,
                "void FromWabtValues(Store &, wasm_val_vec_t *, const ValueTypes &, const Values &)"
               );
}

Assistant:

static void FromWabtValues(Store& store,
                           wasm_val_vec_t* values,
                           const ValueTypes& types,
                           const Values& wabt_values) {
  assert(types.size() == wabt_values.size());
  assert(types.size() == values->size);
  for (size_t i = 0; i < types.size(); ++i) {
    values->data[i] =
        FromWabtValue(store, TypedValue{types[i], wabt_values[i]});
  }
}